

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

uint prvTidygetNextErrorCode(TidyIterator *iter)

{
  TidyIterator p_Var1;
  ulong uVar2;
  long lVar3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var1 = *iter;
    if (p_Var1 == (TidyIterator)0x0) {
      lVar3 = 0;
      p_Var1 = (TidyIterator)0x0;
    }
    else {
      if (tidyErrorCodeListSize_array_size == 0) {
        uVar2 = 0;
        do {
          tidyErrorCodeListSize_array_size = (int)uVar2 + 1;
          uVar2 = (ulong)tidyErrorCodeListSize_array_size;
        } while (tidyStringsKeys[uVar2].key != (ctmbstr)0x0);
      }
      if ((TidyIterator)(ulong)tidyErrorCodeListSize_array_size < p_Var1) {
        lVar3 = 0;
      }
      else {
        lVar3 = (long)p_Var1 * 0x10 + 0x1c7f60;
        p_Var1 = (TidyIterator)((long)&p_Var1->_opaque + 1);
      }
    }
    if (tidyErrorCodeListSize_array_size == 0) {
      uVar2 = 0;
      do {
        tidyErrorCodeListSize_array_size = (int)uVar2 + 1;
        uVar2 = (ulong)tidyErrorCodeListSize_array_size;
      } while (tidyStringsKeys[uVar2].key != (ctmbstr)0x0);
    }
    p_Var4 = (TidyIterator)0x0;
    if (p_Var1 <= (TidyIterator)(ulong)tidyErrorCodeListSize_array_size) {
      p_Var4 = p_Var1;
    }
    *iter = p_Var4;
    return *(uint *)(lVar3 + 8);
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                ,0x5d4,"uint prvTidygetNextErrorCode(TidyIterator *)");
}

Assistant:

uint TY_(getNextErrorCode)( TidyIterator* iter )
{
    const tidyStringsKeyItem *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyErrorCodeListSize() )
    {
        item = &tidyStringsKeys[itemIndex - 1];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyErrorCodeListSize() ? itemIndex : (size_t)0 );
    return item->value;
}